

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void __thiscall
pdqsort_detail::
sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
          (pdqsort_detail *this,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> a,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> b,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> c,
          anon_class_16_2_fd512ddf comp)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int __tmp_2;
  HighsCutGeneration *pHVar8;
  ulong uVar9;
  int __tmp;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  
  pHVar8 = comp.this;
  iVar5 = *(int *)this;
  lVar10 = (long)iVar5;
  lVar7 = (long)*a._M_current;
  lVar11 = *(long *)(c._M_current + 0x14);
  dVar2 = *(double *)(lVar11 + lVar7 * 8);
  if ((1.5 <= dVar2) || (*(double *)(lVar11 + lVar10 * 8) <= 1.5)) {
    if ((dVar2 <= 1.5) ||
       (pdVar1 = (double *)(lVar11 + lVar10 * 8), 1.5 < *pdVar1 || *pdVar1 == 1.5)) {
      dVar2 = *(double *)(*(long *)(c._M_current + 0x30) + lVar7 * 8);
      dVar15 = *(double *)(*(long *)(c._M_current + 0x1a) + lVar7 * 8) * dVar2;
      dVar3 = *(double *)(*(long *)(c._M_current + 0x30) + lVar10 * 8);
      dVar16 = *(double *)(*(long *)(c._M_current + 0x1a) + lVar10 * 8) * dVar3;
      dVar4 = *(double *)(c._M_current + 0x2c);
      if (dVar16 + dVar4 < dVar15) goto LAB_002877e0;
      if (dVar16 - dVar4 <= dVar15) {
        if (ABS(dVar2 - dVar3) <= dVar4) {
          uVar6 = (ulong)*(uint *)(*(long *)(c._M_current + 0x32) + lVar7 * 4);
          lVar7 = (ulong)*(uint *)&pHVar8->lpRelaxation + 0x8a183895eeac1536;
          lVar12 = (ulong)*(uint *)&pHVar8->lpRelaxation + 0x80c8963be3e4c2f3;
          uVar6 = (uVar6 + 0xc8497d2a400d9551) * lVar12 >> 0x20 ^
                  (uVar6 + 0x42d8680e260ae5b) * lVar7;
          uVar9 = (ulong)*(uint *)(*(long *)(c._M_current + 0x32) + lVar10 * 4);
          uVar9 = (uVar9 + 0xc8497d2a400d9551) * lVar12 >> 0x20 ^
                  (uVar9 + 0x42d8680e260ae5b) * lVar7;
          bVar13 = uVar6 < uVar9;
          bVar14 = uVar6 == uVar9;
        }
        else {
          bVar14 = dVar2 == dVar3;
          bVar13 = dVar2 < dVar3;
        }
        if (!bVar13 && !bVar14) goto LAB_002877e0;
      }
    }
  }
  else {
LAB_002877e0:
    *(int *)this = *a._M_current;
    *a._M_current = iVar5;
  }
  iVar5 = *a._M_current;
  lVar10 = (long)iVar5;
  lVar7 = (long)*b._M_current;
  dVar2 = *(double *)(lVar11 + lVar7 * 8);
  if ((1.5 <= dVar2) || (*(double *)(lVar11 + lVar10 * 8) <= 1.5)) {
    if ((1.5 < dVar2) &&
       (pdVar1 = (double *)(lVar11 + lVar10 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5))
    goto LAB_0028786a;
    dVar2 = *(double *)(*(long *)(c._M_current + 0x30) + lVar7 * 8);
    dVar15 = *(double *)(*(long *)(c._M_current + 0x1a) + lVar7 * 8) * dVar2;
    dVar3 = *(double *)(*(long *)(c._M_current + 0x30) + lVar10 * 8);
    dVar16 = *(double *)(*(long *)(c._M_current + 0x1a) + lVar10 * 8) * dVar3;
    dVar4 = *(double *)(c._M_current + 0x2c);
    if (dVar15 <= dVar16 + dVar4) {
      if (dVar15 < dVar16 - dVar4) goto LAB_0028786a;
      if (ABS(dVar2 - dVar3) <= dVar4) {
        uVar6 = (ulong)*(uint *)(*(long *)(c._M_current + 0x32) + lVar7 * 4);
        lVar7 = (ulong)*(uint *)&pHVar8->lpRelaxation + 0x8a183895eeac1536;
        lVar12 = (ulong)*(uint *)&pHVar8->lpRelaxation + 0x80c8963be3e4c2f3;
        uVar6 = (uVar6 + 0xc8497d2a400d9551) * lVar12 >> 0x20 ^ (uVar6 + 0x42d8680e260ae5b) * lVar7;
        uVar9 = (ulong)*(uint *)(*(long *)(c._M_current + 0x32) + lVar10 * 4);
        uVar9 = (uVar9 + 0xc8497d2a400d9551) * lVar12 >> 0x20 ^ (uVar9 + 0x42d8680e260ae5b) * lVar7;
        bVar13 = uVar6 < uVar9;
        bVar14 = uVar6 == uVar9;
      }
      else {
        bVar14 = dVar2 == dVar3;
        bVar13 = dVar2 < dVar3;
      }
      if (bVar13 || bVar14) goto LAB_0028786a;
    }
  }
  *a._M_current = *b._M_current;
  *b._M_current = iVar5;
LAB_0028786a:
  iVar5 = *(int *)this;
  lVar7 = (long)iVar5;
  lVar10 = (long)*a._M_current;
  dVar2 = *(double *)(lVar11 + lVar10 * 8);
  if ((1.5 <= dVar2) || (*(double *)(lVar11 + lVar7 * 8) <= 1.5)) {
    if ((1.5 < dVar2) && (pdVar1 = (double *)(lVar11 + lVar7 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5)
       ) {
      return;
    }
    dVar2 = *(double *)(*(long *)(c._M_current + 0x30) + lVar10 * 8);
    dVar15 = *(double *)(*(long *)(c._M_current + 0x1a) + lVar10 * 8) * dVar2;
    dVar3 = *(double *)(*(long *)(c._M_current + 0x30) + lVar7 * 8);
    dVar16 = *(double *)(*(long *)(c._M_current + 0x1a) + lVar7 * 8) * dVar3;
    dVar4 = *(double *)(c._M_current + 0x2c);
    if (dVar15 <= dVar16 + dVar4) {
      if (dVar15 < dVar16 - dVar4) {
        return;
      }
      if (ABS(dVar2 - dVar3) <= dVar4) {
        uVar6 = (ulong)*(uint *)(*(long *)(c._M_current + 0x32) + lVar10 * 4);
        lVar10 = (ulong)*(uint *)&pHVar8->lpRelaxation + 0x8a183895eeac1536;
        lVar11 = (ulong)*(uint *)&pHVar8->lpRelaxation + 0x80c8963be3e4c2f3;
        uVar6 = (uVar6 + 0xc8497d2a400d9551) * lVar11 >> 0x20 ^ (uVar6 + 0x42d8680e260ae5b) * lVar10
        ;
        uVar9 = (ulong)*(uint *)(*(long *)(c._M_current + 0x32) + lVar7 * 4);
        uVar9 = (uVar9 + 0xc8497d2a400d9551) * lVar11 >> 0x20 ^ (uVar9 + 0x42d8680e260ae5b) * lVar10
        ;
        bVar13 = uVar6 < uVar9;
        bVar14 = uVar6 == uVar9;
      }
      else {
        bVar14 = dVar2 == dVar3;
        bVar13 = dVar2 < dVar3;
      }
      if (bVar13 || bVar14) {
        return;
      }
    }
  }
  *(int *)this = *a._M_current;
  *a._M_current = iVar5;
  return;
}

Assistant:

inline void sort2(Iter a, Iter b, Compare comp) {
        if (comp(*b, *a)) std::iter_swap(a, b);
    }